

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_mdtm(Curl_easy *data)

{
  connectdata *pcVar1;
  ftp_conn *ftpc;
  connectdata *conn;
  CURLcode result;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  if ((((*(ulong *)&(data->set).field_0x8ca >> 7 & 1) == 0) && ((data->set).timecondition == '\0'))
     || ((pcVar1->proto).ftpc.file == (char *)0x0)) {
    conn._4_4_ = ftp_state_type(data);
  }
  else {
    conn._4_4_ = Curl_pp_sendf(data,&(pcVar1->proto).ftpc.pp,"MDTM %s",(pcVar1->proto).ftpc.file);
    if (conn._4_4_ == CURLE_OK) {
      _ftp_state(data,'\x12');
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode ftp_state_mdtm(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  /* Requested time of file or time-depended transfer? */
  if((data->set.get_filetime || data->set.timecondition) && ftpc->file) {

    /* we have requested to get the modified-time of the file, this is a white
       spot as the MDTM is not mentioned in RFC959 */
    result = Curl_pp_sendf(data, &ftpc->pp, "MDTM %s", ftpc->file);

    if(!result)
      ftp_state(data, FTP_MDTM);
  }
  else
    result = ftp_state_type(data);

  return result;
}